

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O2

bool __thiscall PrintableString::SetValue(PrintableString *this,char *str)

{
  byte bVar1;
  int iVar2;
  char *tmp;
  
  if (str == (char *)0x0) {
    return false;
  }
  while( true ) {
    bVar1 = *str;
    if (bVar1 == 0) {
      std::__cxx11::string::assign((char *)&this->value);
      return true;
    }
    iVar2 = isalnum((int)(char)bVar1);
    if ((iVar2 == 0) &&
       ((0x3f < bVar1 || ((0xa400fb8100000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)))) break;
    str = (char *)((byte *)str + 1);
  }
  return false;
}

Assistant:

bool PrintableString::SetValue(const char * str)
{
	const char* tmp = str;
	if (str == nullptr)
		return false;

	for (; *tmp != '\0'; ++tmp)
	{
		if (!isalnum(*tmp))
		{
			switch (*tmp)
			{
			case ' ':
			case '\'':
			case '(':
			case ')':
			case '+':
			case ',':
			case '-':
			case '.':
			case '/':
			case ':':
			case '=':
			case '?':
				break;
			default:
				return false;
			}
		}
	}

	value = str;
	return true;
}